

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
int_writer<long_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,char **it)

{
  basic_string_view<char> sep;
  add_thousands_sep<char> sep_00;
  char *pcVar1;
  char *in_RSI;
  size_t in_RDI;
  undefined8 unaff_retaddr;
  basic_string_view<char> s;
  int in_stack_ffffffffffffffd4;
  unsigned_long in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  size_t local_18;
  
  basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)&stack0xffffffffffffffe0,(char *)(in_RDI + 0xc),1);
  sep.size_ = local_18;
  sep.data_ = in_stack_ffffffffffffffe0;
  internal::add_thousands_sep<char>::add_thousands_sep
            ((add_thousands_sep<char> *)&stack0xffffffffffffffc8,sep);
  sep_00.sep_.size_ = in_RDI;
  sep_00.sep_.data_ = in_RSI;
  sep_00._16_8_ = unaff_retaddr;
  pcVar1 = internal::
           format_decimal<char,unsigned_long,char*,fmt::v5::internal::add_thousands_sep<char>>
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                      sep_00);
  *(char **)in_RSI = pcVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }